

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
 __thiscall ninx::parser::Parser::parse_function_call_argument(Parser *this)

{
  bool bVar1;
  int iVar2;
  Token *pTVar3;
  ParserException *pPVar4;
  string *in_RSI;
  undefined1 local_c8 [8];
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  value;
  string local_b8;
  Token *local_98;
  Token *error_token;
  string local_88;
  undefined1 local_68 [8];
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  id_ptr;
  string local_58;
  Token *local_38;
  Token *raw_token;
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  local_20;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  id;
  Parser *this_local;
  __single_object *argument;
  
  std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>::
  unique_ptr<std::default_delete<std::__cxx11::string>,void>
            ((unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>> *)&local_20
             ,(nullptr_t)0x0);
  iVar2 = TokenReader::check_limiter((TokenReader *)(in_RSI + 1),'{');
  if (iVar2 == 0) {
    pTVar3 = TokenReader::peek_token((TokenReader *)(in_RSI + 1));
    iVar2 = (*pTVar3->_vptr_Token[2])();
    if (iVar2 != 3) {
      local_38 = TokenReader::get_token((TokenReader *)(in_RSI + 1));
      iVar2 = (*local_38->_vptr_Token[2])();
      if (iVar2 != 0) {
        id_ptr._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._6_1_ = 1;
        pPVar4 = (ParserException *)__cxa_allocate_exception(0x20);
        pTVar3 = local_38;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_58,
                   "Invalid function argument name. It must be alphanumeric, and begin with a letter."
                   ,(allocator *)
                    ((long)&id_ptr._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 7));
        exception::ParserException::ParserException(pPVar4,pTVar3,in_RSI,&local_58);
        id_ptr._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._6_1_ = 0;
        __cxa_throw(pPVar4,&exception::ParserException::typeinfo,
                    exception::ParserException::~ParserException);
      }
      if (local_38 != (Token *)0x0) {
        __dynamic_cast(local_38,&lexer::token::Token::typeinfo,&lexer::token::Text::typeinfo,0);
      }
      lexer::token::Text::get_identifier_abi_cxx11_((Text *)local_68);
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_68);
      if (!bVar1) {
        error_token._6_1_ = 1;
        pPVar4 = (ParserException *)__cxa_allocate_exception(0x20);
        pTVar3 = local_38;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_88,
                   "Invalid function argument name. It must be alphanumeric, and begin with a letter."
                   ,(allocator *)((long)&error_token + 7));
        exception::ParserException::ParserException(pPVar4,pTVar3,in_RSI,&local_88);
        error_token._6_1_ = 0;
        __cxa_throw(pPVar4,&exception::ParserException::typeinfo,
                    exception::ParserException::~ParserException);
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_20,
                  (unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_68);
      iVar2 = TokenReader::check_limiter((TokenReader *)(in_RSI + 1),'=');
      if (iVar2 != 1) {
        local_98 = TokenReader::get_token((TokenReader *)(in_RSI + 1));
        value._M_t.
        super___uniq_ptr_impl<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
        ._M_t.
        super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
        .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl._6_1_ = 1;
        pPVar4 = (ParserException *)__cxa_allocate_exception(0x20);
        pTVar3 = local_98;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_b8,"Expected \'=\' after argument name, but could not find one."
                   ,(allocator *)
                    ((long)&value._M_t.
                            super___uniq_ptr_impl<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
                            .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>.
                            _M_head_impl + 7));
        exception::ParserException::ParserException(pPVar4,pTVar3,in_RSI,&local_b8);
        value._M_t.
        super___uniq_ptr_impl<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
        ._M_t.
        super__Tuple_impl<0UL,_ninx::parser::element::Expression_*,_std::default_delete<ninx::parser::element::Expression>_>
        .super__Head_base<0UL,_ninx::parser::element::Expression_*,_false>._M_head_impl._6_1_ = 0;
        __cxa_throw(pPVar4,&exception::ParserException::typeinfo,
                    exception::ParserException::~ParserException);
      }
      TokenReader::get_token((TokenReader *)(in_RSI + 1));
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_68);
    }
  }
  parse_expression((Parser *)local_c8);
  std::
  make_unique<ninx::parser::element::FunctionCallArgument,std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>,std::unique_ptr<ninx::parser::element::Expression,std::default_delete<ninx::parser::element::Expression>>>
            ((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this,&local_20);
  std::
  unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
  ::~unique_ptr((unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                 *)local_c8);
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_20);
  return (__uniq_ptr_data<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>,_true,_true>
          )(__uniq_ptr_data<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<FunctionCallArgument> ninx::parser::Parser::parse_function_call_argument() {
    // Check if the function call argument use implicit naming ( without the argument name )
    // to do that, check if there is the beginning of a block.

    std::unique_ptr<std::string> id{nullptr}; // Argument name

    if (reader.check_limiter('{') == 0 && reader.peek_token()->get_type() != Type::VARIABLE) {
        auto raw_token{reader.get_token()};

        if (raw_token->get_type() != Type::TEXT) {
            throw ParserException(raw_token, this->origin,
                                  "Invalid function argument name. It must be alphanumeric, and begin with a letter.");
        }
        auto id_ptr{dynamic_cast<ninx::lexer::token::Text *>(raw_token)->get_identifier()};
        if (!id_ptr) {
            throw ParserException(raw_token, this->origin,
                                  "Invalid function argument name. It must be alphanumeric, and begin with a letter.");
        }
        id = std::move(id_ptr);

        if (reader.check_limiter('=') != 1) {
            auto error_token{reader.get_token()};
            throw ParserException(error_token, this->origin,
                                  "Expected '=' after argument name, but could not find one.");
        }
        reader.get_token();  // Skip the = limiter
    }

    auto value{parse_expression()};

    auto argument = std::make_unique<FunctionCallArgument>(std::move(id), std::move(value));

    return argument;
}